

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcoefct.c
# Opt level: O0

void start_output_pass(j_decompress_ptr cinfo)

{
  j_decompress_ptr cinfo_local;
  
  cinfo->output_iMCU_row = 0;
  return;
}

Assistant:

METHODDEF(void)
start_output_pass (j_decompress_ptr cinfo)
{
#ifdef BLOCK_SMOOTHING_SUPPORTED
  my_coef_ptr coef = (my_coef_ptr) cinfo->coef;

  /* If multipass, check to see whether to use block smoothing on this pass */
  if (coef->pub.coef_arrays != NULL) {
    if (cinfo->do_block_smoothing && smoothing_ok(cinfo))
      coef->pub.decompress_data = decompress_smooth_data;
    else
      coef->pub.decompress_data = decompress_data;
  }
#endif
  cinfo->output_iMCU_row = 0;
}